

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proto3_arena_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::Proto3OptionalTest_Extensions_Test::
~Proto3OptionalTest_Extensions_Test(Proto3OptionalTest_Extensions_Test *this)

{
  Proto3OptionalTest_Extensions_Test *this_local;
  
  ~Proto3OptionalTest_Extensions_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Proto3OptionalTest, Extensions) {
  const DescriptorPool* p = DescriptorPool::generated_pool();
  const FieldDescriptor* no_optional = p->FindExtensionByName(
      "proto2_unittest.Proto3OptionalExtensions.ext_no_optional");
  const FieldDescriptor* with_optional = p->FindExtensionByName(
      "proto2_unittest.Proto3OptionalExtensions.ext_with_optional");
  ABSL_CHECK(no_optional);
  ABSL_CHECK(with_optional);

  const Descriptor* d = proto2_unittest::Proto3OptionalExtensions::descriptor();
  EXPECT_TRUE(d->options().HasExtension(
      proto2_unittest::Proto3OptionalExtensions::ext_no_optional));
  EXPECT_TRUE(d->options().HasExtension(
      proto2_unittest::Proto3OptionalExtensions::ext_with_optional));
  EXPECT_EQ(8, d->options().GetExtension(
                   proto2_unittest::Proto3OptionalExtensions::ext_no_optional));
  EXPECT_EQ(16,
            d->options().GetExtension(
                proto2_unittest::Proto3OptionalExtensions::ext_with_optional));

  const Descriptor* d2 = proto2_unittest::TestProto3Optional::descriptor();
  EXPECT_FALSE(d2->options().HasExtension(
      proto2_unittest::Proto3OptionalExtensions::ext_no_optional));
  EXPECT_FALSE(d2->options().HasExtension(
      proto2_unittest::Proto3OptionalExtensions::ext_with_optional));
}